

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isubd-cc.cpp
# Opt level: O2

bool loadBuffers(void)

{
  bool bVar1;
  
  bVar1 = loadTransformBuffer();
  if (bVar1) {
    bVar1 = loadPatchBuffer();
    if (bVar1) {
      bVar1 = loadSubdivisionBuffers();
      if (bVar1) {
        bVar1 = loadSubdCounterBuffer((int *)0x0);
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

bool loadBuffers()
{
    bool v = true;

    if (v) v&= loadTransformBuffer();
    if (v) v&= loadPatchBuffer();
    if (v) v&= loadSubdivisionBuffers();
    if (v) v&= loadSubdCounterBuffer();

    return v;
}